

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palettes.cpp
# Opt level: O0

Palette * cppurses::Palettes::Standard(void)

{
  Palette *in_RDI;
  
  memcpy(in_RDI,&DAT_0024953a,0x80);
  return in_RDI;
}

Assistant:

Palette Palettes::Standard() {
    return {{{Color::Black, {0, 0, 0}},
             {Color::Dark_red, {128, 0, 0}},
             {Color::Dark_blue, {0, 0, 128}},
             {Color::Dark_gray, {105, 105, 105}},
             {Color::Brown, {128, 128, 0}},
             {Color::Green, {0, 128, 0}},
             {Color::Red, {255, 0, 0}},
             {Color::Gray, {128, 128, 128}},
             {Color::Blue, {0, 0, 255}},
             {Color::Orange, {255, 165, 0}},
             {Color::Light_gray, {192, 192, 192}},
             {Color::Light_green, {0, 255, 0}},
             {Color::Violet, {255, 0, 255}},
             {Color::Light_blue, {0, 255, 255}},
             {Color::Yellow, {255, 255, 0}},
             {Color::White, {255, 255, 255}}}};
}